

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

void __thiscall Chip8::CPU::reset(CPU *this)

{
  this->_registers[0] = '\0';
  this->_registers[1] = '\0';
  this->_registers[2] = '\0';
  this->_registers[3] = '\0';
  this->_registers[4] = '\0';
  this->_registers[5] = '\0';
  this->_registers[6] = '\0';
  this->_registers[7] = '\0';
  this->_registers[8] = '\0';
  this->_registers[9] = '\0';
  this->_registers[10] = '\0';
  this->_registers[0xb] = '\0';
  this->_registers[0xc] = '\0';
  this->_registers[0xd] = '\0';
  this->_registers[0xe] = '\0';
  this->_registers[0xf] = '\0';
  this->_index_register = 0;
  this->_program_counter = 0x200;
  this->_stack_pointer = 0;
  this->_delay_timer = '\0';
  this->_sound_timer = '\0';
  return;
}

Assistant:

void CPU::reset() {
        _program_counter = 0x200;
        _delay_timer = 0;
        _sound_timer = 0;
        _stack_pointer = 0;
        _index_register = 0;

        std::fill_n(_registers, sizeof(_registers), 0);
    }